

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_connectionsPersistAfterImporting_Test::TestBody
          (Variable_connectionsPersistAfterImporting_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  element_type *peVar7;
  AssertHelper local_728 [8];
  Message local_720 [8];
  shared_ptr<libcellml::Variable> local_718;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_8;
  Message local_6f0 [8];
  shared_ptr<libcellml::Variable> local_6e8;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_7;
  Message local_6c0 [8];
  unsigned_long local_6b8 [2];
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_6;
  Message local_690 [8];
  unsigned_long local_688 [2];
  undefined1 local_678 [8];
  AssertionResult gtest_ar_5;
  string local_660 [39];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [32];
  shared_ptr<libcellml::Component> local_5f0;
  shared_ptr<libcellml::Component> local_5e0;
  undefined1 local_5d0 [8];
  VariablePtr x2;
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [32];
  shared_ptr<libcellml::Component> local_548;
  shared_ptr<libcellml::Component> local_538;
  undefined1 local_528 [8];
  VariablePtr x1;
  Message local_510 [15];
  allocator<char> local_501;
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [32];
  shared_ptr<libcellml::Component> local_490;
  shared_ptr<libcellml::Component> local_480;
  shared_ptr<libcellml::Variable> local_470;
  void *local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_4;
  Message local_440 [15];
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [32];
  shared_ptr<libcellml::Component> local_3c0;
  shared_ptr<libcellml::Component> local_3b0;
  shared_ptr<libcellml::Variable> local_3a0;
  void *local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_3;
  Message local_370 [15];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  shared_ptr<libcellml::Component> local_318;
  shared_ptr<libcellml::Component> local_308;
  void *local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  Message local_2d8 [15];
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [32];
  shared_ptr<libcellml::Component> local_280;
  shared_ptr<libcellml::Component> local_270;
  void *local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_1;
  Message local_240 [15];
  allocator<char> local_231;
  string local_230 [32];
  shared_ptr<libcellml::Component> local_210;
  void *local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  AssertionResult local_1d8 [2];
  AssertHelper local_1b8 [8];
  Message local_1b0 [15];
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__1;
  string local_188 [32];
  string local_168 [32];
  AssertionResult local_148 [2];
  AssertHelper local_128 [8];
  Message local_120 [15];
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  ImportSourcePtr importSource;
  string local_98 [32];
  undefined1 local_78 [8];
  ComponentPtr importedComponent;
  ImporterPtr importer;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Variable_connectionsPersistAfterImporting_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Importer::create((bool)((char)&importedComponent + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"importedComponent",
             (allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  libcellml::ImportSource::create();
  peVar4 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"importedModelWithMaps.cellml",&local_d1);
  libcellml::ImportSource::setUrl((string *)peVar4);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar5 + 0x10));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"importMe",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar5 + 0x10));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_111 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_148,local_110,"model->hasUnresolvedImports()","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x738,pcVar6);
    testing::internal::AssertHelper::operator=(local_128,local_120);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    std::__cxx11::string::~string((string *)local_148);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  peVar7 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importedComponent.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_188,"",(allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  resourcePath(local_168);
  libcellml::Importer::resolveImports((shared_ptr *)peVar7,(string *)local_20);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_1a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1d8,local_1a0,"model->hasUnresolvedImports()","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73a,pcVar6);
    testing::internal::AssertHelper::operator=(local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    std::__cxx11::string::~string((string *)local_1d8);
    testing::Message::~Message(local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::operator=
            ((shared_ptr<libcellml::Model> *)local_20,
             (shared_ptr<libcellml::Model> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  local_200 = (void *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"importedComponent",&local_231);
  libcellml::ComponentEntity::component((string *)&local_210,SUB81(peVar3,0));
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)local_1f8,"nullptr","model->component(\"importedComponent\")",&local_200,
             &local_210);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(local_240);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_260 = (void *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"importedComponent",&local_2a1);
  libcellml::ComponentEntity::component((string *)&local_280,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"child1",&local_2c9);
  libcellml::ComponentEntity::component((string *)&local_270,SUB81(peVar5,0));
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)local_258,"nullptr",
             "model->component(\"importedComponent\")->component(\"child1\")",&local_260,&local_270)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_270);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(local_2d8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x73f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_2f8 = (void *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"importedComponent",&local_339);
  libcellml::ComponentEntity::component((string *)&local_318,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_360,"child2",&local_361);
  libcellml::ComponentEntity::component((string *)&local_308,SUB81(peVar5,0));
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)local_2f0,"nullptr",
             "model->component(\"importedComponent\")->component(\"child2\")",&local_2f8,&local_308)
  ;
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_308);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(local_370);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x740,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_390 = (void *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"importedComponent",&local_3e1);
  libcellml::ComponentEntity::component((string *)&local_3c0,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"child1",&local_409);
  libcellml::ComponentEntity::component((string *)&local_3b0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_430,"x",&local_431);
  libcellml::Component::variable((string *)&local_3a0);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)local_388,"nullptr",
             "model->component(\"importedComponent\")->component(\"child1\")->variable(\"x\")",
             &local_390,&local_3a0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3a0);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3b0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(local_440);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x741,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_460 = (void *)0x0;
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"importedComponent",&local_4b1);
  libcellml::ComponentEntity::component((string *)&local_490,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"child2",&local_4d9);
  libcellml::ComponentEntity::component((string *)&local_480,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"x",&local_501);
  libcellml::Component::variable((string *)&local_470);
  testing::internal::CmpHelperNE<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            ((internal *)local_458,"nullptr",
             "model->component(\"importedComponent\")->component(\"child2\")->variable(\"x\")",
             &local_460,&local_470);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_470);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_480);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_490);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar2) {
    testing::Message::Message(local_510);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &x1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x742,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &x1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_510);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &x1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_568,"importedComponent",&local_569);
  libcellml::ComponentEntity::component((string *)&local_548,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_590,"child1",&local_591);
  libcellml::ComponentEntity::component((string *)&local_538,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"x",
             (allocator<char> *)
             ((long)&x2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_528);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_538);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_548);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_610,"importedComponent",&local_611);
  libcellml::ComponentEntity::component((string *)&local_5f0,SUB81(peVar3,0));
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"child2",&local_639);
  libcellml::ComponentEntity::component((string *)&local_5e0,SUB81(peVar5,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,"x",(allocator<char> *)((long)&gtest_ar_5.message_.ptr_ + 7));
  libcellml::Component::variable((string *)local_5d0);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_5.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_5e0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_5f0);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  local_688[1] = 1;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_528);
  local_688[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_678,"size_t(1)","x1->equivalentVariableCount()",local_688 + 1,
             local_688);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar2) {
    testing::Message::Message(local_690);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x746,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  local_6b8[1] = 1;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_5d0);
  local_6b8[0] = libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_6a8,"size_t(1)","x2->equivalentVariableCount()",local_6b8 + 1,
             local_6b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar2) {
    testing::Message::Message(local_6c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x747,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_5d0);
  libcellml::Variable::equivalentVariable((ulong)&local_6e8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((EqHelper<false> *)local_6d8,"x1","x2->equivalentVariable(0)",
             (shared_ptr<libcellml::Variable> *)local_528,&local_6e8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_6e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar2) {
    testing::Message::Message(local_6f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x748,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_6f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_528);
  libcellml::Variable::equivalentVariable((ulong)&local_718);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((EqHelper<false> *)local_708,"x2","x1->equivalentVariable(0)",
             (shared_ptr<libcellml::Variable> *)local_5d0,&local_718);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_718);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar2) {
    testing::Message::Message(local_720);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              (local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x749,pcVar6);
    testing::internal::AssertHelper::operator=(local_728,local_720);
    testing::internal::AssertHelper::~AssertHelper(local_728);
    testing::Message::~Message(local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_5d0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_528);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_b0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_78);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Variable, connectionsPersistAfterImporting)
{
    auto model = libcellml::Model::create("model");
    auto importer = libcellml::Importer::create();

    auto importedComponent = libcellml::Component::create("importedComponent");
    model->addComponent(importedComponent);

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("importedModelWithMaps.cellml");
    importedComponent->setImportSource(importSource);
    importedComponent->setImportReference("importMe");

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    EXPECT_NE(nullptr, model->component("importedComponent"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child1"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child2"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child1")->variable("x"));
    EXPECT_NE(nullptr, model->component("importedComponent")->component("child2")->variable("x"));

    auto x1 = model->component("importedComponent")->component("child1")->variable("x");
    auto x2 = model->component("importedComponent")->component("child2")->variable("x");
    EXPECT_EQ(size_t(1), x1->equivalentVariableCount());
    EXPECT_EQ(size_t(1), x2->equivalentVariableCount());
    EXPECT_EQ(x1, x2->equivalentVariable(0));
    EXPECT_EQ(x2, x1->equivalentVariable(0));
}